

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O1

Maybe<kj::Exception> *
capnp::compiler::anon_unknown_0::loadFile
          (Maybe<kj::Exception> *__return_storage_ptr__,Reader file,SchemaLoader *loader,
          bool allNodes,Maybe<kj::Own<capnp::MallocMessageBuilder>_> *messageBuilder,
          uint sharedOrdinalCount)

{
  MallocMessageBuilder *pMVar1;
  StructSchema schema_00;
  Reader brand;
  undefined1 auVar2 [40];
  Reader brand_00;
  Reader reader;
  PointerBuilder builder;
  Fault FVar3;
  uint64_t uVar4;
  StructSchema SVar5;
  long lVar6;
  uint in_R9D;
  long lVar7;
  Orphanage OVar8;
  Orphanage orphanage;
  Schema schema;
  Fault f;
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_evolution_test_c__:711:7)>
  _kjContext711;
  Compiler compiler;
  Builder local_1d0;
  Fault local_1b8;
  RawBrandedSchema *in_stack_fffffffffffffe50;
  WirePointer *in_stack_fffffffffffffe58;
  WirePointer *in_stack_fffffffffffffe60;
  ReadLimiter *local_198;
  word *pwStack_190;
  undefined8 local_188;
  Schema local_180;
  undefined1 local_178 [8];
  StructBuilder SStack_170;
  Builder *local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  Compiler local_c0;
  Module local_68;
  SegmentReader *local_60;
  CapTableReader *pCStack_58;
  void *local_50;
  WirePointer *pWStack_48;
  StructDataBitCount local_40;
  StructPointerCount SStack_3c;
  undefined2 uStack_3a;
  int iStack_38;
  undefined4 uStack_34;
  
  schema_00.super_Schema.raw._4_4_ = 0;
  schema_00.super_Schema.raw._0_4_ = sharedOrdinalCount;
  Compiler::Compiler(&local_c0,COMPILE_ANNOTATIONS);
  local_40 = file._reader.dataSize;
  SStack_3c = file._reader.pointerCount;
  uStack_3a = file._reader._38_2_;
  iStack_38 = file._reader.nestingLimit;
  uStack_34 = file._reader._44_4_;
  local_50 = file._reader.data;
  pWStack_48 = file._reader.pointers;
  local_60 = file._reader.segment;
  pCStack_58 = file._reader.capTable;
  local_68.super_ErrorReporter._vptr_ErrorReporter = (ErrorReporter)&PTR_addError_0020cb10;
  uVar4 = Compiler::add(&local_c0,&local_68);
  if (uVar4 == 0x8123456789abcdef) {
    if (allNodes) {
      Compiler::eagerlyCompile(&local_c0,0x8123456789abcdef,0xffffffff);
      if ((messageBuilder->ptr).ptr != (MallocMessageBuilder *)0x0) {
        pMVar1 = (messageBuilder->ptr).ptr;
        OVar8 = MessageBuilder::getOrphanage(&pMVar1->super_MessageBuilder);
        orphanage.arena = (BuilderArena *)OVar8.capTable;
        local_d8 = 0;
        local_f8 = 0;
        uStack_f0 = 0;
        local_e8 = 0;
        uStack_e0 = 0;
        uStack_d0 = 0x7fffffff;
        auVar2 = ZEXT1640(ZEXT816(0));
        brand._reader._40_8_ = 0x7fffffff;
        brand._reader.segment = (SegmentReader *)auVar2._0_8_;
        brand._reader.capTable = (CapTableReader *)auVar2._8_8_;
        brand._reader.data = (void *)auVar2._16_8_;
        brand._reader.pointers = (WirePointer *)auVar2._24_8_;
        brand._reader.dataSize = auVar2._32_4_;
        brand._reader.pointerCount = auVar2._36_2_;
        brand._reader._38_2_ = auVar2._38_2_;
        local_180 = SchemaLoader::get(&local_c0.loader,0x823456789abcdef1,brand,(Schema)0x20fc40);
        SVar5 = Schema::asStruct(&local_180);
        orphanage.capTable = (CapTableBuilder *)SVar5.super_Schema.raw;
        makeExampleStruct((Orphan<capnp::DynamicStruct> *)local_178,(anon_unknown_0 *)OVar8.arena,
                          orphanage,schema_00,in_R9D);
        MessageBuilder::getRootInternal(&local_1d0,&pMVar1->super_MessageBuilder);
        local_1b8.exception = (Exception *)local_1d0.builder.segment;
        _::PointerBuilder::adopt((PointerBuilder *)&local_1b8,(OrphanBuilder *)(local_178 + 8));
        in_stack_fffffffffffffe50 = (RawBrandedSchema *)local_1d0.builder.capTable;
        in_stack_fffffffffffffe58 = local_1d0.builder.pointer;
        if ((SegmentBuilder *)SStack_170.capTable != (SegmentBuilder *)0x0) {
          _::OrphanBuilder::euthanize((OrphanBuilder *)(local_178 + 8));
          in_stack_fffffffffffffe50 = (RawBrandedSchema *)local_1d0.builder.capTable;
          in_stack_fffffffffffffe58 = local_1d0.builder.pointer;
        }
      }
      SchemaLoader::getAllLoaded((Array<capnp::Schema> *)&local_1b8,&local_c0.loader);
      FVar3.exception = local_1b8.exception;
      if (in_stack_fffffffffffffe50 != (RawBrandedSchema *)0x0) {
        lVar7 = (long)in_stack_fffffffffffffe50 << 3;
        lVar6 = 0;
        do {
          local_1d0.builder.segment =
               *(SegmentBuilder **)((long)(FVar3.exception)->trace + lVar6 + -0x50);
          Schema::getProto((Reader *)local_178,(Schema *)&local_1d0);
          SchemaLoader::load(loader,(Reader *)local_178);
          lVar6 = lVar6 + 8;
        } while (lVar7 != lVar6);
      }
      FVar3.exception = local_1b8.exception;
      if (local_1b8.exception != (Exception *)0x0) {
        local_1b8.exception = (Exception *)0x0;
        (**(code **)*in_stack_fffffffffffffe58)
                  (in_stack_fffffffffffffe58,FVar3.exception,8,in_stack_fffffffffffffe50,
                   in_stack_fffffffffffffe50,0);
      }
      (__return_storage_ptr__->ptr).isSet = false;
    }
    else {
      Compiler::eagerlyCompile(&local_c0,0x8123456789abcdef,1);
      if ((messageBuilder->ptr).ptr != (MallocMessageBuilder *)0x0) {
        pMVar1 = (messageBuilder->ptr).ptr;
        local_108 = 0;
        local_128 = 0;
        uStack_120 = 0;
        local_118 = 0;
        uStack_110 = 0;
        uStack_100 = 0x7fffffff;
        auVar2 = ZEXT1640(ZEXT816(0));
        brand_00._reader._40_8_ = 0x7fffffff;
        brand_00._reader.segment = (SegmentReader *)auVar2._0_8_;
        brand_00._reader.capTable = (CapTableReader *)auVar2._8_8_;
        brand_00._reader.data = (void *)auVar2._16_8_;
        brand_00._reader.pointers = (WirePointer *)auVar2._24_8_;
        brand_00._reader.dataSize = auVar2._32_4_;
        brand_00._reader.pointerCount = auVar2._36_2_;
        brand_00._reader._38_2_ = auVar2._38_2_;
        local_180 = SchemaLoader::get(&local_c0.loader,0x823456789abcdef1,brand_00,(Schema)0x20fc40)
        ;
        Schema::asStruct(&local_180);
        MessageBuilder::getRootInternal(&local_1d0,&pMVar1->super_MessageBuilder);
        builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffe58;
        builder.segment = (SegmentBuilder *)in_stack_fffffffffffffe50;
        builder.pointer = in_stack_fffffffffffffe60;
        _::PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
                  (builder,(StructSchema)local_1d0.builder.capTable);
        _::StructBuilder::asReader((StructBuilder *)(local_178 + 8));
        local_1d0.builder.segment = (SegmentBuilder *)&local_1b8;
        local_1b8.exception = (Exception *)local_178;
        kj::_::Debug::Context::Context((Context *)local_178);
        local_178 = (undefined1  [8])&PTR__Context_0020cb68;
        reader.reader.segment = (SegmentReader *)in_stack_fffffffffffffe50;
        reader.schema.super_Schema.raw = (Schema)(Schema)local_1b8.exception;
        reader.reader.capTable = (CapTableReader *)in_stack_fffffffffffffe58;
        reader.reader.data = in_stack_fffffffffffffe60;
        reader.reader.pointers = (WirePointer *)local_198;
        reader.reader._32_8_ = pwStack_190;
        reader.reader._40_8_ = local_188;
        local_130 = &local_1d0;
        checkExampleStruct(reader,sharedOrdinalCount);
        kj::_::Debug::Context::~Context((Context *)local_178);
      }
      SStack_170.segment = (SegmentBuilder *)&local_c0;
      local_178 = (undefined1  [8])&PTR_run_0020cbd0;
      SStack_170.capTable = (CapTableBuilder *)loader;
      kj::_::runCatchingExceptions(__return_storage_ptr__,(Runnable *)local_178);
    }
    Compiler::~Compiler(&local_c0);
    return __return_storage_ptr__;
  }
  local_1b8.exception = (Exception *)0x0;
  local_178 = (undefined1  [8])0x0;
  SStack_170.segment = (SegmentBuilder *)0x0;
  kj::_::Debug::Fault::init
            (&local_1b8,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
            );
  kj::_::Debug::Fault::fatal(&local_1b8);
}

Assistant:

static kj::Maybe<kj::Exception> loadFile(
    ParsedFile::Reader file, SchemaLoader& loader, bool allNodes,
    kj::Maybe<kj::Own<MallocMessageBuilder>>& messageBuilder,
    uint sharedOrdinalCount) {
  Compiler compiler;
  ModuleImpl module(file);
  KJ_ASSERT(compiler.add(module) == 0x8123456789abcdefllu);

  if (allNodes) {
    // Eagerly compile and load the whole thing.
    compiler.eagerlyCompile(0x8123456789abcdefllu, Compiler::ALL_RELATED_NODES);

    KJ_IF_MAYBE(m, messageBuilder) {
      // Build an example struct using the compiled schema.
      m->get()->adoptRoot(makeExampleStruct(
          m->get()->getOrphanage(), compiler.getLoader().get(0x823456789abcdef1llu).asStruct(),
          sharedOrdinalCount));
    }

    for (auto schema: compiler.getLoader().getAllLoaded()) {
      loader.load(schema.getProto());
    }
    return nullptr;
  } else {
    // Compile the file root so that the children are findable, then load the specific child
    // we want.
    compiler.eagerlyCompile(0x8123456789abcdefllu, Compiler::NODE);

    KJ_IF_MAYBE(m, messageBuilder) {
      // Check that the example struct matches the compiled schema.
      auto root = m->get()->getRoot<DynamicStruct>(
          compiler.getLoader().get(0x823456789abcdef1llu).asStruct()).asReader();
      KJ_CONTEXT(root);
      checkExampleStruct(root, sharedOrdinalCount);
    }

    return kj::runCatchingExceptions([&]() {
      loadStructAndGroups(compiler.getLoader(), loader, 0x823456789abcdef1llu);
    });
  }
}